

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O3

void __thiscall spvtools::opt::MemPass::MemPass(MemPass *this)

{
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__MemPass_00931360;
  (this->seen_target_vars_)._M_h._M_buckets = &(this->seen_target_vars_)._M_h._M_single_bucket;
  (this->seen_target_vars_)._M_h._M_bucket_count = 1;
  (this->seen_target_vars_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->seen_target_vars_)._M_h._M_element_count = 0;
  (this->seen_target_vars_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->seen_target_vars_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->seen_target_vars_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->seen_non_target_vars_)._M_h._M_buckets =
       &(this->seen_non_target_vars_)._M_h._M_single_bucket;
  (this->seen_non_target_vars_)._M_h._M_bucket_count = 1;
  (this->seen_non_target_vars_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->seen_non_target_vars_)._M_h._M_element_count = 0;
  (this->seen_non_target_vars_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->seen_non_target_vars_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->seen_non_target_vars_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->type2undefs_)._M_h._M_buckets = &(this->type2undefs_)._M_h._M_single_bucket;
  (this->type2undefs_)._M_h._M_bucket_count = 1;
  (this->type2undefs_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->type2undefs_)._M_h._M_element_count = 0;
  (this->type2undefs_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->type2undefs_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->type2undefs_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

MemPass::MemPass() {}